

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

JSONObject * __thiscall
Js::JSONStringifier::ReadObject
          (JSONStringifier *this,RecyclableObject *obj,JSONObjectStack *objectStack)

{
  uint uVar1;
  Type this_00;
  code *pcVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  uint32 numericIndex;
  JSONObjectStack *stack;
  JSONObjectStack *pJVar6;
  Recycler *alloc;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *pSVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  JavascriptProxy *proxyObject;
  EnumeratorCache *pEVar10;
  JavascriptString *propertyString;
  ScriptContext *pSVar11;
  undefined1 auStack_b8 [8];
  TrackAllocData data;
  JSONObjectStack local_60;
  uint local_4c;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *local_48;
  PropertyId local_3c;
  ScriptContext *pSStack_38;
  PropertyId nextKey;
  PropertyRecord *propertyRecord;
  
  pJVar6 = objectStack;
  do {
    if (pJVar6->object == obj) {
      JavascriptError::ThrowTypeError(this->scriptContext,-0x7ff5ec56,(PCWSTR)0x0);
    }
    pJVar6 = pJVar6->next;
  } while (pJVar6 != (JSONObjectStack *)0x0);
  local_4c = this->indentLength;
  uVar1 = this->gapLength;
  local_60.object = obj;
  local_60.next = objectStack;
  if (uVar1 != 0) {
    if (CARRY4(uVar1,local_4c)) {
      ::Math::DefaultOverflowPolicy();
    }
    this->indentLength = uVar1 + local_4c;
  }
  this_00.ptr = (SListNodeBase<Memory::Recycler> *)this->scriptContext->recycler;
  auStack_b8 = (undefined1  [8])&SListCounted<Js::JSONObjectProperty,Memory::Recycler>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6a35c48;
  data.filename._0_4_ = 0x23a;
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00.ptr,(TrackAllocData *)auStack_b8);
  pSVar7 = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
           new<Memory::Recycler>(0x18,alloc,0x387914);
  (((SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
   &pSVar7->super_SListNodeBase<Memory::Recycler>)->
  super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
  super_SListNodeBase<Memory::Recycler> = (Type)0x0;
  (pSVar7->super_RealCount).count = 0;
  Memory::Recycler::WBSetBit((char *)pSVar7);
  (((SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
   &pSVar7->super_SListNodeBase<Memory::Recycler>)->
  super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
  super_SListNodeBase<Memory::Recycler> = (SListNodeBase<Memory::Recycler>)pSVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar7);
  (pSVar7->super_RealCount).count = 0;
  pSVar7[1].super_SListNodeBase<Memory::Recycler>.next.ptr = this_00.ptr;
  pSVar11 = (ScriptContext *)this->propertyList;
  local_48 = pSVar7;
  if (pSVar11 == (ScriptContext *)0x0) {
    bVar4 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    if ((bVar4) &&
       (proxyObject = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj),
       proxyObject != (JavascriptProxy *)0x0)) {
      ReadProxy(this,proxyObject,(JSONObject *)local_48,&local_60);
    }
    else {
      auStack_b8 = (undefined1  [8])0x0;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0;
      data.line = 0;
      data._36_4_ = 0;
      JavascriptStaticEnumerator::Clear
                ((JavascriptStaticEnumerator *)auStack_b8,None,(ScriptContext *)0x0);
      pEVar10 = JavascriptLibrary::GetStringifyCache
                          ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,
                           (obj->type).ptr);
      iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2b])
                        (obj,(JavascriptStaticEnumerator *)auStack_b8,0x1c,this->scriptContext,
                         pEVar10);
      if (iVar5 != 0) {
        local_3c = -1;
        propertyString =
             JavascriptStaticEnumerator::MoveAndGetNext
                       ((JavascriptStaticEnumerator *)auStack_b8,&local_3c,(PropertyAttributes *)0x0
                       );
        if (propertyString != (JavascriptString *)0x0) {
          do {
            numericIndex = JavascriptStaticEnumerator::GetCurrentItemIndex
                                     ((JavascriptStaticEnumerator *)auStack_b8);
            if (numericIndex == 0xffffffff) {
              pSStack_38 = (ScriptContext *)0x0;
              if (local_3c == -1) {
                ScriptContext::GetOrAddPropertyRecord
                          (this->scriptContext,propertyString,
                           (PropertyRecord **)&stack0xffffffffffffffc8);
                local_3c = *(PropertyId *)&(pSStack_38->super_ScriptContextBase).javascriptLibrary;
              }
              ReadObjectElement(this,propertyString,(PropertyRecord *)pSStack_38,obj,
                                (JSONObject *)local_48,&local_60);
            }
            else {
              ReadObjectElement(this,propertyString,numericIndex,obj,(JSONObject *)local_48,
                                &local_60);
            }
            propertyString =
                 JavascriptStaticEnumerator::MoveAndGetNext
                           ((JavascriptStaticEnumerator *)auStack_b8,&local_3c,
                            (PropertyAttributes *)0x0);
          } while (propertyString != (JavascriptString *)0x0);
        }
      }
    }
  }
  else {
    auStack_b8 = (undefined1  [8])pSVar11;
    data.typeinfo = (type_info *)pSVar11;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar11 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
        pSVar11 = (ScriptContext *)data.typeinfo;
      }
      auVar3 = auStack_b8;
      pSVar11 = (ScriptContext *)
                (((SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>
                   *)&pSVar11->super_ScriptContextInfo)->super_SListNodeBase<Memory::Recycler>).next
                .ptr;
      Memory::Recycler::WBSetBit((char *)&stack0xffffffffffffffc8);
      pSStack_38 = pSVar11;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&stack0xffffffffffffffc8);
      if ((undefined1  [8])pSStack_38 == auVar3) break;
      pSVar11 = *(ScriptContext **)data.typeinfo;
      Memory::Recycler::WBSetBit((char *)&stack0xffffffffffffffc8);
      pSStack_38 = pSVar11;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&stack0xffffffffffffffc8);
      data.typeinfo = (type_info *)pSStack_38;
      pTVar9 = SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::
               Iterator::Data((Iterator *)auStack_b8);
      ReadObjectElement(this,(pTVar9->propertyName).ptr,(pTVar9->propertyRecord).ptr,obj,
                        (JSONObject *)local_48,&local_60);
      pSVar11 = (ScriptContext *)data.typeinfo;
    }
  }
  pSVar7 = local_48;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Reverse(local_48);
  uVar1 = local_4c;
  CalculateStringifiedLength(this,(pSVar7->super_RealCount).count,local_4c);
  this->indentLength = uVar1;
  return (JSONObject *)pSVar7;
}

Assistant:

JSONObject*
JSONStringifier::ReadObject(_In_ RecyclableObject* obj, _In_ JSONObjectStack* objectStack)
{
    if (objectStack->Has(obj))
    {
        JavascriptError::ThrowTypeError(this->scriptContext, JSERR_JSONSerializeCircular);
    }
    JSONObjectStack stack = { 0 };
    stack.next = objectStack;
    stack.object = obj;

    // Increase indentation
    const charcount_t stepbackLength = this->indentLength;
    if (this->gapLength != 0)
    {
        this->indentLength = UInt32Math::Add(this->indentLength, this->gapLength);
    }

    Recycler* recycler = this->scriptContext->GetRecycler();
    JSONObject* jsonObject = RecyclerNew(recycler, JSONObject, recycler);

    // If we are given a property list, we should only read the listed properties
    if (this->propertyList != nullptr)
    {
        FOREACH_SLIST_ENTRY(PropertyListElement, entry, this->propertyList)
        {
            this->ReadObjectElement(entry.propertyName, entry.propertyRecord, obj, jsonObject, &stack);
        }
        NEXT_SLIST_ENTRY;
    }
    else
    {
        // Enumerating proxies is different than normal objects, so enumerate them separately
        JavascriptProxy* proxyObject = JavascriptOperators::TryFromVar<JavascriptProxy>(obj);
        if (proxyObject != nullptr)
        {
            this->ReadProxy(proxyObject, jsonObject, &stack);
        }
        else
        {
            JavascriptStaticEnumerator enumerator;
            EnumeratorCache* cache = this->scriptContext->GetLibrary()->GetStringifyCache(obj->GetType());
            if (obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EphemeralReference | EnumeratorFlags::UseCache, this->scriptContext, cache))
            {
                JavascriptString* propertyName = nullptr;
                PropertyId nextKey = Constants::NoProperty;
                while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != nullptr)
                {
                    const uint32 numericIndex = enumerator.GetCurrentItemIndex();
                    if (numericIndex != Constants::InvalidSourceIndex)
                    {
                        this->ReadObjectElement(propertyName, numericIndex, obj, jsonObject, &stack);
                    }
                    else
                    {
                        PropertyRecord const * propertyRecord = nullptr;
                        if (nextKey == Constants::NoProperty)
                        {
                            this->scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
                            nextKey = propertyRecord->GetPropertyId();
                        }
                        this->ReadObjectElement(propertyName, propertyRecord, obj, jsonObject, &stack);
                    }
                }
            }
        }
    }
    // JSONObject is an SList, which only has push/pop, so need to reverse list for it to be in order
    jsonObject->Reverse();
    const uint propertyCount = jsonObject->Count();

    this->CalculateStringifiedLength(propertyCount, stepbackLength);

    // Restore indent level
    this->indentLength = stepbackLength;

    return jsonObject;
}